

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tufted_laplacian.cpp
# Opt level: O0

void geometrycentral::surface::buildIntrinsicTuftedCover
               (SurfaceMesh *mesh,EdgeData<double> *edgeLengths,EmbeddedGeometryInterface *posGeom)

{
  Face e_00;
  Halfedge e_01;
  Halfedge e_02;
  Face e_03;
  Face e_04;
  Vertex e_05;
  Vertex e_06;
  Halfedge e_07;
  Edge e_08;
  Edge e_09;
  Edge e_10;
  Halfedge e_11;
  __normal_iterator<geometrycentral::surface::Halfedge_*,_std::vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>_>
  __first;
  Halfedge heB_00;
  Halfedge heA;
  Face f;
  Face f_00;
  bool bVar1;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> *pEVar3;
  bool bVar2;
  bool *pbVar4;
  Vector3 *pVVar5;
  size_type sVar6;
  long in_RDX;
  Vector3 *this;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> EVar7;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> EVar8;
  Halfedge HVar9;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> EVar10;
  Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh> EVar11;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> EVar12;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> EVar13;
  Edge EVar14;
  Edge newE;
  Halfedge nextHe;
  size_t i;
  Halfedge currHe;
  anon_class_8_1_2150afb6 sortFunc;
  anon_class_24_3_ca2f44c0 edgeAngle;
  array<geometrycentral::Vector3,_2UL> eBasis;
  Vector3 edgeVec;
  Vector3 pTip;
  Vector3 pTail;
  Halfedge he;
  NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator> __end3;
  NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator> __begin3;
  NavigationSetBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator> *__range3;
  vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
  edgeFaces;
  Edge e;
  RangeIteratorBase<geometrycentral::surface::EdgeRangeF> __end2_1;
  RangeIteratorBase<geometrycentral::surface::EdgeRangeF> __begin2_1;
  EdgeSet *__range2_1;
  EdgeData<bool> isOrigEdge;
  Halfedge heB;
  Halfedge heF;
  Face fBack;
  Face fFront;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __end2;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __begin2;
  FaceSet *__range2;
  FaceData<bool> isFront;
  HalfedgeData<Halfedge> otherSheet;
  RangeIteratorBase<geometrycentral::surface::EdgeRangeF> *in_stack_fffffffffffff968;
  ParentMeshT *in_stack_fffffffffffff970;
  value_type *in_stack_fffffffffffff978;
  anon_class_8_1_2150afb6 in_stack_fffffffffffff980;
  __normal_iterator<geometrycentral::surface::Halfedge_*,_std::vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>_>
  in_stack_fffffffffffff988;
  undefined7 in_stack_fffffffffffff990;
  undefined1 in_stack_fffffffffffff997;
  ParentMeshT *in_stack_fffffffffffff998;
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::surface::Halfedge>
  *in_stack_fffffffffffff9a0;
  ParentMeshT *in_stack_fffffffffffffab0;
  size_t in_stack_fffffffffffffab8;
  ParentMeshT *in_stack_fffffffffffffac0;
  size_t in_stack_fffffffffffffac8;
  ParentMeshT *in_stack_fffffffffffffad0;
  SurfaceMesh *in_stack_fffffffffffffb50;
  ParentMeshT *in_stack_fffffffffffffb58;
  SurfaceMesh *in_stack_fffffffffffffb60;
  ParentMeshT *in_stack_fffffffffffffb68;
  size_t in_stack_fffffffffffffb70;
  ulong local_430;
  Vector3 local_3a0;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_388;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> local_378;
  Vector3 local_368;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_348;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> local_338;
  Vector3 local_328;
  Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh> local_310;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_300;
  NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator> local_2f0 [2];
  NavigationSetBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator> local_2c0;
  NavigationSetBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator> *local_298;
  vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
  local_290;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> local_278;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> local_260;
  undefined1 local_220 [24];
  undefined1 *local_208;
  Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh> local_1c8;
  Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh> local_1b8;
  ParentMeshT *local_1a8;
  size_t local_1a0;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_198;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_188;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_178;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_168;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_158;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_148;
  Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh> local_138;
  Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh> local_128;
  Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh> local_118;
  Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh> local_100;
  undefined1 local_c0 [24];
  undefined1 *local_a8;
  long local_18;
  
  local_18 = in_RDX;
  if (in_RDX != 0) {
    EmbeddedGeometryInterface::requireVertexPositions((EmbeddedGeometryInterface *)0x2e6a87);
    EmbeddedGeometryInterface::requireFaceNormals((EmbeddedGeometryInterface *)0x2e6a94);
  }
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::surface::Halfedge>::MeshData
            (in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
  MeshData<geometrycentral::surface::Face,_bool>::MeshData
            ((MeshData<geometrycentral::surface::Face,_bool> *)in_stack_fffffffffffff9a0,
             in_stack_fffffffffffff998,(bool)in_stack_fffffffffffff997);
  SurfaceMesh::faces(in_stack_fffffffffffff970);
  local_a8 = local_c0;
  RangeSetBase<geometrycentral::surface::FaceRangeF>::begin
            ((RangeSetBase<geometrycentral::surface::FaceRangeF> *)in_stack_fffffffffffff970);
  RangeSetBase<geometrycentral::surface::FaceRangeF>::end
            ((RangeSetBase<geometrycentral::surface::FaceRangeF> *)in_stack_fffffffffffff970);
  EVar8.ind = in_stack_fffffffffffffac8;
  EVar8.mesh = in_stack_fffffffffffffad0;
  EVar7.ind = in_stack_fffffffffffffab8;
  EVar7.mesh = in_stack_fffffffffffffac0;
  while( true ) {
    bVar1 = RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator!=
                      ((RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)
                       in_stack_fffffffffffff970,
                       (RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)
                       in_stack_fffffffffffff968);
    if (!bVar1) break;
    EVar11 = (Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>)
             RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator*
                       ((RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)0x2e6b57);
    e_00.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind.
    _0_7_ = in_stack_fffffffffffff990;
    e_00.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)in_stack_fffffffffffff988._M_current;
    e_00.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind.
    _7_1_ = in_stack_fffffffffffff997;
    local_118 = EVar11;
    local_100 = EVar11;
    pbVar4 = MeshData<geometrycentral::surface::Face,_bool>::operator[]
                       ((MeshData<geometrycentral::surface::Face,_bool> *)
                        in_stack_fffffffffffff980.edgeAngle,e_00);
    if ((*pbVar4 & 1U) != 0) {
      f_00.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind
           = in_stack_fffffffffffffb70;
      f_00.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh
           = in_stack_fffffffffffffb68;
      local_138 = local_100;
      EVar11 = (Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>)
               SurfaceMesh::duplicateFace(in_stack_fffffffffffffb60,f_00);
      local_128 = EVar11;
      EVar7 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
              Face::halfedge((Face *)in_stack_fffffffffffff970);
      local_148 = EVar7;
      EVar7 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
              Face::halfedge((Face *)in_stack_fffffffffffff970);
      local_158 = EVar7;
      do {
        e_01.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind
        ._0_7_ = in_stack_fffffffffffff990;
        e_01.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
        mesh = (ParentMeshT *)in_stack_fffffffffffff988._M_current;
        e_01.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind
        ._7_1_ = in_stack_fffffffffffff997;
        local_168 = local_148;
        pEVar3 = &MeshData<geometrycentral::surface::Halfedge,_geometrycentral::surface::Halfedge>::
                  operator[]((MeshData<geometrycentral::surface::Halfedge,_geometrycentral::surface::Halfedge>
                              *)in_stack_fffffffffffff980.edgeAngle,e_01)->
                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
        ;
        *pEVar3 = local_158;
        e_02.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind
        ._0_7_ = in_stack_fffffffffffff990;
        e_02.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
        mesh = (ParentMeshT *)in_stack_fffffffffffff988._M_current;
        e_02.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind
        ._7_1_ = in_stack_fffffffffffff997;
        local_178 = local_158;
        pEVar3 = &MeshData<geometrycentral::surface::Halfedge,_geometrycentral::surface::Halfedge>::
                  operator[]((MeshData<geometrycentral::surface::Halfedge,_geometrycentral::surface::Halfedge>
                              *)in_stack_fffffffffffff980.edgeAngle,e_02)->
                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
        ;
        *pEVar3 = local_148;
        EVar8 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
                Halfedge::next((Halfedge *)in_stack_fffffffffffff970);
        local_188 = EVar8;
        local_148 = EVar8;
        EVar7 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
                Halfedge::next((Halfedge *)in_stack_fffffffffffff970);
        local_198 = EVar7;
        local_158 = EVar7;
        HVar9 = Face::halfedge((Face *)in_stack_fffffffffffff970);
        local_1a0 = HVar9.
                    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                    .ind;
        in_stack_fffffffffffffab0 =
             HVar9.
             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
             .mesh;
        local_1a8 = in_stack_fffffffffffffab0;
        bVar1 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
                operator!=((Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                            *)in_stack_fffffffffffff970,
                           (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                            *)in_stack_fffffffffffff968);
      } while (bVar1);
      f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
           (size_t)in_stack_fffffffffffffb60;
      f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
           in_stack_fffffffffffffb58;
      local_1b8 = local_128;
      SurfaceMesh::invertOrientation(in_stack_fffffffffffffb50,f);
      e_03.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind.
      _0_7_ = in_stack_fffffffffffff990;
      e_03.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh
           = (ParentMeshT *)in_stack_fffffffffffff988._M_current;
      e_03.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind.
      _7_1_ = in_stack_fffffffffffff997;
      local_1c8 = local_128;
      pbVar4 = MeshData<geometrycentral::surface::Face,_bool>::operator[]
                         ((MeshData<geometrycentral::surface::Face,_bool> *)
                          in_stack_fffffffffffff980.edgeAngle,e_03);
      *pbVar4 = false;
    }
    RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator++
              ((RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)in_stack_fffffffffffff970)
    ;
  }
  MeshData<geometrycentral::surface::Edge,_bool>::MeshData
            ((MeshData<geometrycentral::surface::Edge,_bool> *)in_stack_fffffffffffff9a0,
             in_stack_fffffffffffff998,(bool)in_stack_fffffffffffff997);
  SurfaceMesh::edges(in_stack_fffffffffffff970);
  local_208 = local_220;
  RangeSetBase<geometrycentral::surface::EdgeRangeF>::begin
            ((RangeSetBase<geometrycentral::surface::EdgeRangeF> *)in_stack_fffffffffffff970);
  RangeSetBase<geometrycentral::surface::EdgeRangeF>::end
            ((RangeSetBase<geometrycentral::surface::EdgeRangeF> *)in_stack_fffffffffffff970);
  while( true ) {
    bVar1 = RangeIteratorBase<geometrycentral::surface::EdgeRangeF>::operator!=
                      ((RangeIteratorBase<geometrycentral::surface::EdgeRangeF> *)
                       in_stack_fffffffffffff970,in_stack_fffffffffffff968);
    if (!bVar1) break;
    EVar10 = (Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>)
             RangeIteratorBase<geometrycentral::surface::EdgeRangeF>::operator*
                       ((RangeIteratorBase<geometrycentral::surface::EdgeRangeF> *)0x2e6fd6);
    EVar14.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind.
    _0_7_ = in_stack_fffffffffffff990;
    EVar14.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh
         = (ParentMeshT *)in_stack_fffffffffffff988._M_current;
    EVar14.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind.
    _7_1_ = in_stack_fffffffffffff997;
    local_278 = EVar10;
    local_260 = EVar10;
    pbVar4 = MeshData<geometrycentral::surface::Edge,_bool>::operator[]
                       ((MeshData<geometrycentral::surface::Edge,_bool> *)
                        in_stack_fffffffffffff980.edgeAngle,EVar14);
    if ((*pbVar4 & 1U) != 0) {
      ::std::
      vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
      ::vector((vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
                *)0x2e7079);
      Edge::adjacentHalfedges((Edge *)in_stack_fffffffffffff980.edgeAngle);
      local_298 = &local_2c0;
      NavigationSetBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator>::begin
                ((NavigationSetBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator> *)
                 in_stack_fffffffffffff980.edgeAngle);
      NavigationSetBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator>::end
                (local_2f0,local_298);
      while( true ) {
        bVar1 = NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator>::
                operator!=((NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator>
                            *)in_stack_fffffffffffff970,
                           (NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator>
                            *)in_stack_fffffffffffff968);
        if (!bVar1) break;
        EVar12 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 )NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator>::
                  operator*((NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator>
                             *)0x2e710b);
        local_300 = EVar12;
        EVar11 = (Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>)
                 Halfedge::face((Halfedge *)in_stack_fffffffffffff970);
        e_04.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
        ind._0_7_ = in_stack_fffffffffffff990;
        e_04.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
        mesh = (ParentMeshT *)in_stack_fffffffffffff988._M_current;
        e_04.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
        ind._7_1_ = in_stack_fffffffffffff997;
        local_310 = EVar11;
        pbVar4 = MeshData<geometrycentral::surface::Face,_bool>::operator[]
                           ((MeshData<geometrycentral::surface::Face,_bool> *)
                            in_stack_fffffffffffff980.edgeAngle,e_04);
        if ((*pbVar4 & 1U) != 0) {
          ::std::
          vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
          ::push_back((vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
                       *)in_stack_fffffffffffff980.edgeAngle,in_stack_fffffffffffff978);
        }
        NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator>::operator++
                  ((NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator>
                    *)in_stack_fffffffffffff970);
      }
      if (local_18 != 0) {
        EVar12 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 )Edge::halfedge((Edge *)in_stack_fffffffffffff970);
        local_348 = EVar12;
        EVar13 = (Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>)
                 Halfedge::tailVertex((Halfedge *)0x2e7276);
        this = (Vector3 *)EVar13.ind;
        e_05.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
        ind._0_7_ = in_stack_fffffffffffff990;
        e_05.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
        mesh = (ParentMeshT *)in_stack_fffffffffffff988._M_current;
        e_05.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
        ind._7_1_ = in_stack_fffffffffffff997;
        local_338 = EVar13;
        pVVar5 = MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector3>::operator[]
                           ((MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector3> *)
                            in_stack_fffffffffffff980.edgeAngle,e_05);
        local_328.z = pVVar5->z;
        local_328.x = pVVar5->x;
        local_328.y = pVVar5->y;
        EVar12 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 )Edge::halfedge((Edge *)in_stack_fffffffffffff970);
        local_388 = EVar12;
        EVar13 = (Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>)
                 Halfedge::tipVertex((Halfedge *)in_stack_fffffffffffff970);
        e_06.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
        ind._0_7_ = in_stack_fffffffffffff990;
        e_06.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
        mesh = (ParentMeshT *)in_stack_fffffffffffff988._M_current;
        e_06.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
        ind._7_1_ = in_stack_fffffffffffff997;
        local_378 = EVar13;
        pVVar5 = MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector3>::operator[]
                           ((MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector3> *)
                            in_stack_fffffffffffff980.edgeAngle,e_06);
        local_368.z = pVVar5->z;
        local_368.x = pVVar5->x;
        local_368.y = pVVar5->y;
        Vector3::operator-(&local_3a0,&local_368,&local_328);
        Vector3::buildTangentBasis(this);
        ::std::
        vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
        ::begin((vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
                 *)in_stack_fffffffffffff968);
        ::std::
        vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
        ::end((vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
               *)in_stack_fffffffffffff968);
        __first._M_current._7_1_ = in_stack_fffffffffffff997;
        __first._M_current._0_7_ = in_stack_fffffffffffff990;
        ::std::
        sort<__gnu_cxx::__normal_iterator<geometrycentral::surface::Halfedge*,std::vector<geometrycentral::surface::Halfedge,std::allocator<geometrycentral::surface::Halfedge>>>,geometrycentral::surface::buildIntrinsicTuftedCover(geometrycentral::surface::SurfaceMesh&,geometrycentral::MeshData<geometrycentral::surface::Edge,double>&,geometrycentral::surface::EmbeddedGeometryInterface*)::__0>
                  (__first,in_stack_fffffffffffff988,in_stack_fffffffffffff980);
      }
      ::std::
      vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
      ::front((vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
               *)in_stack_fffffffffffff970);
      bVar1 = Halfedge::orientation((Halfedge *)0x2e74c6);
      if (bVar1) {
        HVar9.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind
        ._0_7_ = in_stack_fffffffffffff990;
        HVar9.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
        mesh = (ParentMeshT *)in_stack_fffffffffffff988._M_current;
        HVar9.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind
        ._7_1_ = in_stack_fffffffffffff997;
        MeshData<geometrycentral::surface::Halfedge,_geometrycentral::surface::Halfedge>::operator[]
                  ((MeshData<geometrycentral::surface::Halfedge,_geometrycentral::surface::Halfedge>
                    *)in_stack_fffffffffffff980.edgeAngle,HVar9);
      }
      local_430 = 0;
      while( true ) {
        sVar6 = ::std::
                vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
                ::size(&local_290);
        if (sVar6 <= local_430) break;
        sVar6 = ::std::
                vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
                ::size(&local_290);
        ::std::
        vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
        ::operator[](&local_290,(local_430 + 1) % sVar6);
        bVar1 = Halfedge::orientation((Halfedge *)0x2e75b5);
        bVar2 = Halfedge::orientation((Halfedge *)0x2e75d6);
        if (bVar1 == bVar2) {
          e_07.
          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          ind._0_7_ = in_stack_fffffffffffff990;
          e_07.
          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          mesh = (ParentMeshT *)in_stack_fffffffffffff988._M_current;
          e_07.
          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          ind._7_1_ = in_stack_fffffffffffff997;
          MeshData<geometrycentral::surface::Halfedge,_geometrycentral::surface::Halfedge>::
          operator[]((MeshData<geometrycentral::surface::Halfedge,_geometrycentral::surface::Halfedge>
                      *)in_stack_fffffffffffff980.edgeAngle,e_07);
        }
        heA.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
        .ind = (size_t)EVar8.mesh;
        heA.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
        .mesh = (ParentMeshT *)EVar8.ind;
        heB_00.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind
             = (size_t)EVar7.mesh;
        heB_00.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
        mesh = (ParentMeshT *)EVar7.ind;
        EVar14 = SurfaceMesh::separateToNewEdge(in_stack_fffffffffffffab0,heA,heB_00);
        in_stack_fffffffffffff990 =
             (undefined7)
             EVar14.
             super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
             ind;
        in_stack_fffffffffffff997 =
             EVar14.
             super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
             ind._7_1_;
        e_08.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
        ind._0_7_ = in_stack_fffffffffffff990;
        e_08.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
        mesh = (ParentMeshT *)in_stack_fffffffffffff988._M_current;
        e_08.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
        ind._7_1_ = in_stack_fffffffffffff997;
        in_stack_fffffffffffff988._M_current =
             (Halfedge *)
             MeshData<geometrycentral::surface::Edge,_bool>::operator[]
                       ((MeshData<geometrycentral::surface::Edge,_bool> *)
                        in_stack_fffffffffffff980.edgeAngle,e_08);
        *(bool *)&((in_stack_fffffffffffff988._M_current)->
                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                  ).mesh = false;
        e_09.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
        ind._0_7_ = in_stack_fffffffffffff990;
        e_09.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
        mesh = (ParentMeshT *)in_stack_fffffffffffff988._M_current;
        e_09.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
        ind._7_1_ = in_stack_fffffffffffff997;
        in_stack_fffffffffffff980.edgeAngle =
             (anon_class_24_3_ca2f44c0 *)
             MeshData<geometrycentral::surface::Edge,_double>::operator[]
                       (in_stack_fffffffffffff980.edgeAngle,e_09);
        in_stack_fffffffffffff970 =
             ((MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector3> *)
             in_stack_fffffffffffff980.edgeAngle)->mesh;
        e_10.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
        ind._0_7_ = in_stack_fffffffffffff990;
        e_10.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
        mesh = (ParentMeshT *)in_stack_fffffffffffff988._M_current;
        e_10.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
        ind._7_1_ = in_stack_fffffffffffff997;
        in_stack_fffffffffffff978 =
             (value_type *)
             MeshData<geometrycentral::surface::Edge,_double>::operator[]
                       ((MeshData<geometrycentral::surface::Edge,_double> *)
                        in_stack_fffffffffffff980.edgeAngle,e_10);
        (in_stack_fffffffffffff978->
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>).
        mesh = in_stack_fffffffffffff970;
        e_11.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind
        ._0_7_ = in_stack_fffffffffffff990;
        e_11.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
        mesh = (ParentMeshT *)in_stack_fffffffffffff988._M_current;
        e_11.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind
        ._7_1_ = in_stack_fffffffffffff997;
        in_stack_fffffffffffff968 =
             (RangeIteratorBase<geometrycentral::surface::EdgeRangeF> *)
             MeshData<geometrycentral::surface::Halfedge,_geometrycentral::surface::Halfedge>::
             operator[]((MeshData<geometrycentral::surface::Halfedge,_geometrycentral::surface::Halfedge>
                         *)in_stack_fffffffffffff980.edgeAngle,e_11);
        local_430 = local_430 + 1;
      }
      ::std::
      vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
      ::~vector((vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
                 *)in_stack_fffffffffffff980.edgeAngle);
    }
    RangeIteratorBase<geometrycentral::surface::EdgeRangeF>::operator++
              ((RangeIteratorBase<geometrycentral::surface::EdgeRangeF> *)in_stack_fffffffffffff970)
    ;
  }
  MeshData<geometrycentral::surface::Edge,_bool>::~MeshData
            ((MeshData<geometrycentral::surface::Edge,_bool> *)in_stack_fffffffffffff970);
  MeshData<geometrycentral::surface::Face,_bool>::~MeshData
            ((MeshData<geometrycentral::surface::Face,_bool> *)in_stack_fffffffffffff970);
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::surface::Halfedge>::~MeshData
            ((MeshData<geometrycentral::surface::Halfedge,_geometrycentral::surface::Halfedge> *)
             in_stack_fffffffffffff970);
  return;
}

Assistant:

void buildIntrinsicTuftedCover(SurfaceMesh& mesh, EdgeData<double>& edgeLengths, EmbeddedGeometryInterface* posGeom) {

  if (posGeom) {
    posGeom->requireVertexPositions();
    posGeom->requireFaceNormals();
  }

  // == Transform the connectivity of the input in to that of the tufted cover

  // Create two copies of each input face
  HalfedgeData<Halfedge> otherSheet(mesh);
  FaceData<bool> isFront(mesh, true); // original copy serves as front
  for (Face fFront : mesh.faces()) {
    if (!isFront[fFront]) continue; // only process original faces

    // create the new face, orient it in the opposite direction
    Face fBack = mesh.duplicateFace(fFront);

    // read off the correspondence bewteen the halfedges, before inverting
    Halfedge heF = fFront.halfedge();
    Halfedge heB = fBack.halfedge();
    do {
      otherSheet[heF] = heB;
      otherSheet[heB] = heF;
      heF = heF.next();
      heB = heB.next();
    } while (heF != fFront.halfedge());

    mesh.invertOrientation(fBack);

    isFront[fBack] = false;
  }


  // Around each edge, glue back faces to front along newly created edges
  EdgeData<bool> isOrigEdge(mesh, true);
  for (Edge e : mesh.edges()) {
    if (!isOrigEdge[e]) continue;

    // Gather the original faces incident on the edge (represented by the halfedge along the edge)
    std::vector<Halfedge> edgeFaces;
    for (Halfedge he : e.adjacentHalfedges()) {
      if (isFront[he.face()]) edgeFaces.push_back(he);
    }

    // If we have normals, use them for an angular sort.
    // Otherwise, just use the "natural" (arbitrary) ordering
    if (posGeom) {

      Vector3 pTail = posGeom->vertexPositions[e.halfedge().tailVertex()];
      Vector3 pTip = posGeom->vertexPositions[e.halfedge().tipVertex()];
      Vector3 edgeVec = pTip - pTail;
      std::array<Vector3, 2> eBasis = edgeVec.buildTangentBasis();

      auto edgeAngle = [&](const Halfedge& he) {
        Vector3 oppVert = posGeom->vertexPositions[he.next().tipVertex()];
        Vector3 outVec = unit(oppVert - pTail);
        return ::std::atan2(dot(std::get<1>(eBasis), outVec), dot(std::get<0>(eBasis), outVec));
      };
      auto sortFunc = [&](const Halfedge& heA, const Halfedge& heB) -> bool { return edgeAngle(heA) > edgeAngle(heB); };

      std::sort(edgeFaces.begin(), edgeFaces.end(), sortFunc);
    }


    // Sequentially connect the faces
    Halfedge currHe = edgeFaces.front();
    if (currHe.orientation()) currHe = otherSheet[currHe];
    for (size_t i = 0; i < edgeFaces.size(); i++) {
      Halfedge nextHe = edgeFaces[(i + 1) % edgeFaces.size()];
      if (currHe.orientation() == nextHe.orientation()) nextHe = otherSheet[nextHe];
      Edge newE = mesh.separateToNewEdge(currHe, nextHe);
      isOrigEdge[newE] = false;
      edgeLengths[newE] = edgeLengths[e];
      currHe = otherSheet[nextHe];
    }
  }

  // sanity checks
  // if (mesh.hasBoundary()) throw std::runtime_error("has boundary");
  // if (!mesh.isEdgeManifold()) throw std::runtime_error("not edge manifold");
  // if (!mesh.isOriented()) throw std::runtime_error("not oriented");
}